

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O2

bool __thiscall bloom_parameters::operator!(bloom_parameters *this)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((((this->minimum_size <= this->maximum_size) &&
       (this->minimum_number_of_hashes - 1 < this->maximum_number_of_hashes)) &&
      (this->projected_element_count != 0)) &&
     (dVar1 = this->false_positive_probability, dVar2 = ABS(dVar1),
     (0x3fe < (uint)((long)dVar2 + 0xfff0000000000000U >> 0x35) || -1 < (long)dVar1) &&
     (dVar2 != INFINITY && (0xffffffffffffe < (long)dVar2 - 1U || -1 < (long)dVar1)))) {
    bVar3 = this->random_seed + 1 < 2;
  }
  return bVar3;
}

Assistant:

inline bool operator!()
   {
      return (minimum_size > maximum_size)      ||
             (minimum_number_of_hashes > maximum_number_of_hashes) ||
             (minimum_number_of_hashes < 1)     ||
             (0 == maximum_number_of_hashes)    ||
             (0 == projected_element_count)     ||
             (false_positive_probability < 0.0) ||
             (std::numeric_limits<double>::infinity() == std::abs(false_positive_probability)) ||
             (0 == random_seed)                 ||
             (0xFFFFFFFFFFFFFFFFULL == random_seed);
   }